

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthForallNew(uint *pRes,uint *pTruth,int nVars,int iVar)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int Step;
  int k;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  uint *pTruth_local;
  uint *pRes_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x368,"void Kit_TruthForallNew(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pRes[Step] = pTruth[Step] &
                   ((pTruth[Step] & 0xaaaaaaaa) >> 1 | (pTruth[Step] & 0x55555555) << 1);
    }
    break;
  case 1:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pRes[Step] = pTruth[Step] &
                   ((pTruth[Step] & 0xcccccccc) >> 2 | (pTruth[Step] & 0x33333333) << 2);
    }
    break;
  case 2:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pRes[Step] = pTruth[Step] &
                   ((pTruth[Step] & 0xf0f0f0f0) >> 4 | (pTruth[Step] & 0xf0f0f0f) << 4);
    }
    break;
  case 3:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pRes[Step] = pTruth[Step] &
                   ((pTruth[Step] & 0xff00ff00) >> 8 | (pTruth[Step] & 0xff00ff) << 8);
    }
    break;
  case 4:
    for (Step = 0; Step < iVar1; Step = Step + 1) {
      pRes[Step] = pTruth[Step] & (pTruth[Step] >> 0x10 | pTruth[Step] << 0x10);
    }
    break;
  default:
    iVar2 = 1 << ((char)iVar - 5U & 0x1f);
    _iVar_local = pTruth;
    pTruth_local = pRes;
    for (local_2c = 0; local_2c < iVar1; local_2c = iVar2 * 2 + local_2c) {
      for (Step = 0; Step < iVar2; Step = Step + 1) {
        pTruth_local[Step] = _iVar_local[Step] & _iVar_local[iVar2 + Step];
        pTruth_local[iVar2 + Step] = pTruth_local[Step];
      }
      pTruth_local = pTruth_local + (iVar2 << 1);
      _iVar_local = _iVar_local + (iVar2 << 1);
    }
  }
  return;
}

Assistant:

void Kit_TruthForallNew( unsigned * pRes, unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1));
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2));
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4));
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8));
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16));
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pRes[i]      = pTruth[i] & pTruth[Step+i];
                pRes[Step+i] = pRes[i];
            }
            pRes += 2*Step;
            pTruth += 2*Step;
        }
        return;
    }
}